

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

ON_BrepEdge * __thiscall ON_Brep::NewEdge(ON_Brep *this,int c3i)

{
  int iVar1;
  ON_BrepEdge *this_00;
  
  iVar1 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count;
  this_00 = ON_ClassArray<ON_BrepEdge>::AppendNew((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
  this_00->m_tolerance = -1.23432101234321e+308;
  this_00->m_edge_index = iVar1;
  this_00->m_c3i = c3i;
  if ((-1 < c3i) && (c3i < (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
    ON_CurveProxy::SetProxyCurve
              (&this_00->super_ON_CurveProxy,
               (this->m_C3).super_ON_SimpleArray<ON_Curve_*>.m_a[(uint)c3i]);
  }
  this_00->m_brep = this;
  return this_00;
}

Assistant:

ON_BrepEdge& 
ON_Brep::NewEdge( int c3i )
{
  int ei = m_E.Count();
  ON_BrepEdge& edge = m_E.AppendNew();
  edge.m_tolerance = ON_UNSET_VALUE;
  edge.m_edge_index = ei;
  edge.m_c3i = c3i;
  if ( edge.m_c3i >= 0 && edge.m_c3i < m_C3.Count() ) 
  {
    edge.SetProxyCurve(m_C3[edge.m_c3i]);
  }
  edge.m_brep = this;
  return edge;
}